

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O3

bool FIX::Message::isTrailerField(int field,DataDictionary *pD)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  bool bVar5;
  
  bVar5 = true;
  if (((field != 10) && (field != 0x59)) && (field != 0x5d)) {
    if (pD == (DataDictionary *)0x0) {
      return false;
    }
    p_Var2 = (pD->m_trailerFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var4 = &(pD->m_trailerFields)._M_t._M_impl.super__Rb_tree_header;
    p_Var1 = &p_Var4->_M_header;
    p_Var3 = &p_Var4->_M_header;
    if (p_Var2 != (_Base_ptr)0x0) {
      do {
        if (field <= (int)p_Var2[1]._M_color) {
          p_Var1 = p_Var2;
        }
        p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < field];
      } while (p_Var2 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var1 != p_Var4) &&
         (p_Var3 = p_Var1, field < (int)p_Var1[1]._M_color)) {
        p_Var3 = &p_Var4->_M_header;
      }
    }
    bVar5 = (_Rb_tree_header *)p_Var3 != p_Var4;
  }
  return bVar5;
}

Assistant:

bool Message::isTrailerField(int field, const DataDictionary *pD) {
  if (isTrailerField(field)) {
    return true;
  }
  if (pD) {
    return pD->isTrailerField(field);
  }
  return false;
}